

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10f3280::ComputeFlowTest::RunCheckOutput(ComputeFlowTest *this,int run_times)

{
  uchar *puVar1;
  bool bVar2;
  byte bVar3;
  aom_image_t *message;
  aom_image_t *paVar4;
  int64_t iVar5;
  char *message_00;
  int in_ESI;
  AssertHelper *in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  double elapsed_time_simd;
  int i_1;
  double elapsed_time_c;
  int i;
  aom_usec_timer test_timer;
  aom_usec_timer ref_timer;
  int y;
  int x;
  double v_test;
  double v_ref;
  double v_rand;
  double u_test;
  double u_ref;
  double u_rand;
  AssertionResult gtest_ar_1;
  uint8_t *ref;
  AssertionResult gtest_ar;
  uint8_t *src;
  YUVVideoSource video;
  int kHeight;
  int kWidth;
  int in_stack_fffffffffffffd7c;
  undefined8 in_stack_fffffffffffffd80;
  YUVVideoSource *this_00;
  undefined8 in_stack_fffffffffffffd88;
  undefined4 uVar6;
  uchar **val1;
  double *lhs;
  char *in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd98;
  uint in_stack_fffffffffffffd9c;
  char *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  Type in_stack_fffffffffffffdac;
  Type type;
  YUVVideoSource *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdc0;
  uint in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdd0;
  YUVVideoSource *in_stack_fffffffffffffde0;
  AssertionResult local_1e0 [2];
  AssertionResult local_1c0;
  double local_1b0;
  int local_1a4;
  double local_1a0;
  int local_194;
  aom_usec_timer local_190;
  aom_usec_timer local_170;
  int local_150;
  int local_14c;
  double local_148;
  double local_140;
  double local_138;
  VideoSource local_130;
  VideoSource local_128;
  _func_int **local_120;
  undefined8 local_108;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  uchar *ref_00;
  uint in_stack_ffffffffffffff18;
  uint uVar7;
  undefined8 uVar8;
  double *in_stack_ffffffffffffff38;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff40;
  allocator local_99;
  string local_98 [32];
  YUVVideoSource local_78;
  undefined4 local_14;
  undefined4 local_10;
  int local_c;
  
  uVar7 = (uint)((ulong)in_stack_fffffffffffffd80 >> 0x20);
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_10 = 0x160;
  local_14 = 0x120;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"bus_352x288_420_f20_b8.yuv",&local_99);
  val1 = (uchar **)CONCAT44(uVar6,2);
  this_00 = (YUVVideoSource *)((ulong)uVar7 << 0x20);
  libaom_test::YUVVideoSource::YUVVideoSource
            (in_stack_fffffffffffffdb0,
             (string *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             (aom_img_fmt)((ulong)in_stack_fffffffffffffda0 >> 0x20),(uint)in_stack_fffffffffffffda0
             ,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdc8,in_stack_fffffffffffffdd0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  libaom_test::YUVVideoSource::Begin(in_stack_fffffffffffffde0);
  message = libaom_test::YUVVideoSource::img(&local_78);
  puVar1 = message->planes[0];
  uVar8._0_4_ = 0;
  uVar8._4_4_ = 0;
  testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
            ((char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             in_stack_fffffffffffffd90,val1,(void **)this_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff38);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xadfb2c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
               in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90);
    testing::internal::AssertHelper::operator=(in_RDI,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xadfb89);
  }
  uVar7 = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xadfbf7);
  if (uVar7 == 0) {
    libaom_test::YUVVideoSource::Next((YUVVideoSource *)0xadfc15);
    paVar4 = libaom_test::YUVVideoSource::img(&local_78);
    ref_00 = paVar4->planes[0];
    local_108 = (FILE *)0x0;
    testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
              ((char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               in_stack_fffffffffffffd90,val1,(void **)this_00);
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff00);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
      testing::AssertionResult::failure_message((AssertionResult *)0xadfcde);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
                 in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90);
      testing::internal::AssertHelper::operator=(in_RDI,(Message *)message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::Message::~Message((Message *)0xadfd3b);
    }
    uVar7 = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xadfda9);
    if (uVar7 == 0) {
      bVar3 = libaom_test::ACMRandom::Rand8((ACMRandom *)this_00);
      local_130._vptr_VideoSource = (_func_int **)(((double)bVar3 / 255.0) * 10.0 + -5.0);
      local_128._vptr_VideoSource = local_130._vptr_VideoSource;
      local_120 = local_130._vptr_VideoSource;
      bVar3 = libaom_test::ACMRandom::Rand8((ACMRandom *)this_00);
      local_148 = ((double)bVar3 / 255.0) * 10.0 + -5.0;
      local_140 = local_148;
      local_138 = local_148;
      local_14c = libaom_test::ACMRandom::operator()((ACMRandom *)this_00,in_stack_fffffffffffffd7c)
      ;
      local_14c = local_14c + 8;
      local_150 = libaom_test::ACMRandom::operator()((ACMRandom *)this_00,in_stack_fffffffffffffd7c)
      ;
      local_150 = local_150 + 8;
      aom_compute_flow_at_point_c
                ((uint8_t *)CONCAT44(uVar7,in_stack_ffffffffffffff18),ref_00,
                 in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                 in_stack_ffffffffffffff00,(int)uVar8,in_stack_ffffffffffffff38,
                 (double *)in_stack_ffffffffffffff40._M_head_impl);
      lhs = &local_148;
      this_00 = (YUVVideoSource *)&local_130;
      (*(code *)in_RDI[3].data_)(puVar1,ref_00,local_14c,local_150,0x160,0x120,0x160);
      if (local_c < 2) {
        testing::internal::EqHelper::Compare<double,_double,_nullptr>
                  ((char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   in_stack_fffffffffffffd90,lhs,(double *)this_00);
        bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
        type = CONCAT13(bVar2,(int3)in_stack_fffffffffffffdac);
        if (!bVar2) {
          testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
          in_stack_fffffffffffffda0 =
               testing::AssertionResult::failure_message((AssertionResult *)0xae020f);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffdb0,type,in_stack_fffffffffffffda0,
                     in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90);
          testing::internal::AssertHelper::operator=(in_RDI,(Message *)message);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          testing::Message::~Message((Message *)0xae026c);
        }
        uVar7 = (uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0xae02d7);
        if (uVar7 == 0) {
          testing::internal::EqHelper::Compare<double,_double,_nullptr>
                    ((char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                     in_stack_fffffffffffffd90,lhs,(double *)this_00);
          bVar2 = testing::AssertionResult::operator_cast_to_bool(local_1e0);
          uVar8._0_4_ = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd9c);
          if (!bVar2) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
            message_00 = testing::AssertionResult::failure_message((AssertionResult *)0xae037e);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffdb0,type,in_stack_fffffffffffffda0,
                       (int)uVar8,message_00);
            testing::internal::AssertHelper::operator=(in_RDI,(Message *)message);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
            testing::Message::~Message((Message *)0xae03db);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0xae0446);
        }
      }
      else {
        ::aom_usec_timer_start((aom_usec_timer *)0xadffbd);
        for (local_194 = 0; local_194 < local_c; local_194 = local_194 + 1) {
          this_00 = (YUVVideoSource *)&local_128;
          aom_compute_flow_at_point_c
                    ((uint8_t *)CONCAT44(uVar7,in_stack_ffffffffffffff18),ref_00,
                     in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                     in_stack_ffffffffffffff00,(int)uVar8,in_stack_ffffffffffffff38,
                     (double *)in_stack_ffffffffffffff40._M_head_impl);
        }
        ::aom_usec_timer_mark((aom_usec_timer *)0xae0060);
        iVar5 = ::aom_usec_timer_elapsed(&local_170);
        local_1a0 = (double)iVar5;
        ::aom_usec_timer_start((aom_usec_timer *)0xae0096);
        for (local_1a4 = 0; local_1a4 < local_c; local_1a4 = local_1a4 + 1) {
          this_00 = (YUVVideoSource *)&local_130;
          (*(code *)in_RDI[3].data_)
                    (puVar1,ref_00,local_14c,local_150,0x160,0x120,0x160,this_00,&local_148);
        }
        ::aom_usec_timer_mark((aom_usec_timer *)0xae0134);
        iVar5 = ::aom_usec_timer_elapsed(&local_190);
        local_1b0 = (double)iVar5;
        printf("c_time=%fns \t simd_time=%fns \t speedup=%.2f\n",local_1a0,local_1b0,
               local_1a0 / local_1b0);
      }
    }
  }
  libaom_test::YUVVideoSource::~YUVVideoSource(this_00);
  return;
}

Assistant:

void ComputeFlowTest::RunCheckOutput(int run_times) {
  constexpr int kWidth = 352;
  constexpr int kHeight = 288;

  ::libaom_test::YUVVideoSource video("bus_352x288_420_f20_b8.yuv",
                                      AOM_IMG_FMT_I420, kWidth, kHeight, 30, 1,
                                      0, 2);
  // Use Y (Luminance) plane.
  video.Begin();
  uint8_t *src = video.img()->planes[0];
  ASSERT_NE(src, nullptr);
  video.Next();
  uint8_t *ref = video.img()->planes[0];
  ASSERT_NE(ref, nullptr);

  // Pick a random value between -5 and 5. The range was chosen arbitrarily as
  // u and v can take any kind of value in practise, but it shouldn't change the
  // outcome of the tests.
  const double u_rand = (static_cast<double>(rnd_.Rand8()) / 255) * 10 - 5;
  double u_ref = u_rand;
  double u_test = u_rand;

  const double v_rand = (static_cast<double>(rnd_.Rand8()) / 255) * 10 - 5;
  double v_ref = v_rand;
  double v_test = v_rand;

  // Pick a random point in the frame. If the frame is 352x288, that means we
  // can call the function on all values of x comprised between 8 and 344, and
  // all values of y comprised between 8 and 280.
  const int x = rnd_((kWidth - 8) - 8 + 1) + 8;
  const int y = rnd_((kHeight - 8) - 8 + 1) + 8;

  aom_usec_timer ref_timer, test_timer;

  aom_compute_flow_at_point_c(src, ref, x, y, kWidth, kHeight, kWidth, &u_ref,
                              &v_ref);

  target_func_(src, ref, x, y, kWidth, kHeight, kWidth, &u_test, &v_test);

  if (run_times > 1) {
    aom_usec_timer_start(&ref_timer);
    for (int i = 0; i < run_times; ++i) {
      aom_compute_flow_at_point_c(src, ref, x, y, kWidth, kHeight, kWidth,
                                  &u_ref, &v_ref);
    }
    aom_usec_timer_mark(&ref_timer);
    const double elapsed_time_c =
        static_cast<double>(aom_usec_timer_elapsed(&ref_timer));

    aom_usec_timer_start(&test_timer);
    for (int i = 0; i < run_times; ++i) {
      target_func_(src, ref, x, y, kWidth, kHeight, kWidth, &u_test, &v_test);
    }
    aom_usec_timer_mark(&test_timer);
    const double elapsed_time_simd =
        static_cast<double>(aom_usec_timer_elapsed(&test_timer));

    printf("c_time=%fns \t simd_time=%fns \t speedup=%.2f\n", elapsed_time_c,
           elapsed_time_simd, (elapsed_time_c / elapsed_time_simd));
  } else {
    ASSERT_EQ(u_ref, u_test);
    ASSERT_EQ(v_ref, v_test);
  }
}